

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_>::FindKey
          (TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_> *this,cvertex_t key)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Node *local_30;
  Node *n;
  TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_> *pTStack_20;
  THashTraits<cvertex_t> Traits;
  TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_> *this_local;
  cvertex_t key_local;
  
  pTStack_20 = this;
  local_30 = MainPosition(this,key);
  while( true ) {
    bVar3 = false;
    if (local_30 != (Node *)0x0) {
      bVar1 = Node::IsNil(local_30);
      bVar3 = false;
      if (!bVar1) {
        iVar2 = THashTraits<cvertex_t>::Compare
                          ((THashTraits<cvertex_t> *)((long)&n + 7),(local_30->Pair).Key,key);
        bVar3 = iVar2 != 0;
      }
    }
    if (!bVar3) break;
    local_30 = local_30->Next;
  }
  if ((local_30 != (Node *)0x0) && (bVar3 = Node::IsNil(local_30), !bVar3)) {
    return local_30;
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}